

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.c
# Opt level: O0

int killbuffer_cmd(int f,int n)

{
  int iVar1;
  char *bname;
  int ret;
  char *bufp;
  char bufn [1024];
  buffer *local_20;
  buffer *bp;
  int n_local;
  int f_local;
  
  if ((f & 8U) == 0) {
    bname = eread("Kill buffer (default %s): ",(char *)&bufp,0x400,0x4a,(curbp->b_list).l_name);
    if (bname == (char *)0x0) {
      return 2;
    }
    if (*bname == '\0') {
      local_20 = curbp;
    }
    else {
      local_20 = bfind(bname,0);
      if (local_20 == (buffer *)0x0) {
        return 0;
      }
    }
  }
  else {
    local_20 = curbp;
  }
  iVar1 = killbuffer(local_20);
  eerase();
  return iVar1;
}

Assistant:

int
killbuffer_cmd(int f, int n)
{
	struct buffer *bp;
	char    bufn[NBUFN], *bufp;
	int 	ret;

	if (f & FFRAND) /* dired mode 'q' */
		bp = curbp;
	else if ((bufp = eread("Kill buffer (default %s): ", bufn, NBUFN,
	    EFNUL | EFNEW | EFBUF, curbp->b_bname)) == NULL)
		return (ABORT);
	else if (bufp[0] == '\0')
		bp = curbp;
	else if ((bp = bfind(bufp, FALSE)) == NULL)
		return (FALSE);
	ret = killbuffer(bp);
	eerase();

	return (ret);
}